

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O2

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::Unroll
          (LoopUnrollerUtilsImpl *this,Loop *loop,size_t factor)

{
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *this_00;
  pointer *pppIVar1;
  pointer ppBVar2;
  LoopUnrollerUtilsImpl *this_01;
  BasicBlock *condition_block;
  pointer ppIVar3;
  Loop *pLVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  Instruction *pIVar7;
  mapped_type *pmVar8;
  mapped_type *ppIVar9;
  long lVar10;
  uint32_t label;
  undefined8 extraout_RDX;
  undefined8 uVar11;
  undefined8 extraout_RDX_00;
  pointer ppBVar12;
  __node_base *p_Var13;
  pointer ppIVar14;
  ulong uVar15;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  Instruction *induction_clone;
  uint32_t local_1c4;
  size_t local_1c0;
  Loop *local_1b8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_1b0;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  Instruction **local_1a0;
  __node_base *local_198;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_190;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *local_188;
  long local_180;
  BasicBlock **local_178;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *local_170;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> inductions;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> inductions_1;
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  _Stack_128;
  pointer local_120;
  pointer ppIStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  BasicBlock *local_e0;
  __node_base_ptr *local_d8;
  size_type local_d0;
  __node_base local_c8;
  size_type sStack_c0;
  float local_b8;
  size_t local_b0;
  __node_base_ptr p_Stack_a8;
  __node_base_ptr *local_a0;
  size_type local_98;
  __node_base local_90;
  size_type sStack_88;
  float local_80;
  size_t local_78;
  __node_base_ptr p_Stack_70;
  __node_base_ptr *local_68;
  size_type local_60;
  __node_base local_58;
  size_type sStack_50;
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  local_1c0 = factor;
  pIVar7 = BasicBlock::GetLoopMergeInst(loop->loop_header_);
  if (pIVar7 == (Instruction *)0x0) {
    __assert_fail("loop_merge_inst && \"Loop merge instruction could not be found after entering unroller \" \"(should have exited before this)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unroller.cpp"
                  ,0x20b,
                  "void spvtools::opt::(anonymous namespace)::LoopUnrollerUtilsImpl::MarkLoopControlAsDontUnroll(Loop *) const"
                 );
  }
  inductions.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(inductions.
                         super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
  init_list._M_len = 1;
  init_list._M_array = (iterator)&inductions;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)&inductions_1,init_list);
  Instruction::SetInOperand(pIVar7,2,(SmallVector<unsigned_int,_2UL> *)&inductions_1);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector
            ((SmallVector<unsigned_int,_2UL> *)&inductions_1);
  inductions.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  inductions.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  inductions.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Loop::GetInductionVariables(loop,&inductions);
  uStack_108 = this->loop_condition_block_;
  inductions_1.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)this->loop_induction_variable_;
  local_110 = loop->loop_latch_;
  pppIVar1 = &inductions_1.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  inductions_1.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  inductions_1.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_128._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_120 = (pointer)0x0;
  ppIStack_118 = (pointer)0x0;
  local_d8 = &p_Stack_a8;
  local_100 = (Instruction *)0x0;
  uStack_f8 = (BasicBlock *)0x0;
  local_f0 = (BasicBlock *)0x0;
  uStack_e8 = (BasicBlock *)0x0;
  local_d0 = 1;
  local_c8._M_nxt = (_Hash_node_base *)0x0;
  sStack_c0 = 0;
  local_b8 = 1.0;
  local_b0 = 0;
  p_Stack_a8 = (__node_base_ptr)0x0;
  local_a0 = &p_Stack_70;
  local_98 = 1;
  local_90._M_nxt = (_Hash_node_base *)0x0;
  sStack_88 = 0;
  local_80 = 1.0;
  local_78 = 0;
  p_Stack_70 = (__node_base_ptr)0x0;
  local_68 = &p_Stack_38;
  local_60 = 1;
  local_58._M_nxt = (_Hash_node_base *)0x0;
  sStack_50 = 0;
  local_48 = 1.0;
  local_40 = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  local_1b8 = loop;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  _M_move_assign((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)pppIVar1,&inductions);
  (this->state_).previous_phi_ =
       (Instruction *)
       inductions_1.
       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_188 = &(this->state_).previous_phis_;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  _M_move_assign(local_188,pppIVar1);
  __range2 = &(this->state_).new_phis_;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  _M_move_assign(__range2,&_Stack_128);
  local_178 = &(this->state_).previous_latch_block_;
  (this->state_).new_latch_block = local_e0;
  *(undefined4 *)&(this->state_).new_condition_block = (undefined4)local_f0;
  *(undefined4 *)((long)&(this->state_).new_condition_block + 4) = local_f0._4_4_;
  *(undefined4 *)&(this->state_).new_header_block = (undefined4)uStack_e8;
  *(undefined4 *)((long)&(this->state_).new_header_block + 4) = uStack_e8._4_4_;
  *(undefined4 *)&(this->state_).new_phi = (undefined4)local_100;
  *(undefined4 *)((long)&(this->state_).new_phi + 4) = local_100._4_4_;
  *(undefined4 *)&(this->state_).new_continue_block = (undefined4)uStack_f8;
  *(undefined4 *)((long)&(this->state_).new_continue_block + 4) = uStack_f8._4_4_;
  *(undefined4 *)&(this->state_).previous_latch_block_ = (undefined4)local_110;
  *(undefined4 *)((long)&(this->state_).previous_latch_block_ + 4) = local_110._4_4_;
  *(undefined4 *)&(this->state_).previous_condition_block_ = (undefined4)uStack_108;
  *(undefined4 *)((long)&(this->state_).previous_condition_block_ + 4) = uStack_108._4_4_;
  local_190 = &(this->state_).new_blocks._M_h;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(local_190,&local_d8);
  this_00 = &(this->state_).new_inst;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(&this_00->_M_h,&local_a0);
  local_1b0 = &(this->state_).ids_to_new_inst._M_h;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(local_1b0,&local_68);
  LoopUnrollState::~LoopUnrollState((LoopUnrollState *)&inductions_1);
  local_1c0 = local_1c0 - 1;
  local_198 = &(this->state_).new_blocks._M_h._M_before_begin;
  local_170 = &this->invalidated_instructions_;
  local_1a0 = &(this->state_).new_phi;
  lVar10 = 0;
  do {
    if (lVar10 == local_1c0) {
      std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ::~_Vector_base(&inductions.
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     );
      return;
    }
    ppBVar2 = (this->loop_blocks_inorder_).
              super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_180 = lVar10;
    for (ppBVar12 = (this->loop_blocks_inorder_).
                    super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppBVar12 != ppBVar2;
        ppBVar12 = ppBVar12 + 1) {
      CopyBasicBlock(this,local_1b8,*ppBVar12,false);
    }
    pIVar7 = BasicBlock::terminator((this->state_).previous_latch_block_);
    uVar5 = BasicBlock::id((this->state_).new_header_block);
    induction_clone = (Instruction *)CONCAT44(induction_clone._4_4_,uVar5);
    init_list_00._M_len = 1;
    init_list_00._M_array = (iterator)&induction_clone;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&inductions_1,init_list_00);
    Instruction::SetInOperand(pIVar7,0,(SmallVector<unsigned_int,_2UL> *)&inductions_1);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&inductions_1);
    IRContext::UpdateDefUse(this->context_,pIVar7);
    pIVar7 = BasicBlock::terminator((this->state_).new_latch_block);
    pLVar4 = local_1b8;
    uVar5 = BasicBlock::id(local_1b8->loop_header_);
    induction_clone = (Instruction *)CONCAT44(induction_clone._4_4_,uVar5);
    init_list_01._M_len = 1;
    init_list_01._M_array = (iterator)&induction_clone;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&inductions_1,init_list_01);
    Instruction::SetInOperand(pIVar7,0,(SmallVector<unsigned_int,_2UL> *)&inductions_1);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&inductions_1);
    IRContext::AnalyzeUses(this->context_,pIVar7);
    inductions_1.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    inductions_1.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    inductions_1.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Loop::GetInductionVariables(pLVar4,&inductions_1);
    uVar11 = extraout_RDX;
    for (uVar15 = 0;
        uVar15 < (ulong)((long)inductions_1.
                               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)inductions_1.
                               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar15 = uVar15 + 1)
    {
      pIVar7 = inductions_1.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar15];
      uVar5 = Instruction::result_id(pIVar7);
      if (uVar5 == 0) {
        __assert_fail("primary_copy->result_id() != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unroller.cpp"
                      ,0x2ba,
                      "void spvtools::opt::(anonymous namespace)::LoopUnrollerUtilsImpl::CopyBody(Loop *, bool)"
                     );
      }
      uVar5 = Instruction::result_id(pIVar7);
      induction_clone = (Instruction *)CONCAT44(induction_clone._4_4_,uVar5);
      pmVar8 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)&induction_clone);
      ppIVar9 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)local_1b0,pmVar8);
      induction_clone = *ppIVar9;
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      push_back(__range2,&induction_clone);
      uVar5 = Instruction::result_id(induction_clone);
      if (uVar5 == 0) {
        __assert_fail("induction_clone->result_id() != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unroller.cpp"
                      ,0x2bf,
                      "void spvtools::opt::(anonymous namespace)::LoopUnrollerUtilsImpl::CopyBody(Loop *, bool)"
                     );
      }
      ppIVar14 = (this->state_).previous_phis_.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (ppIVar14 ==
          (this->state_).previous_phis_.
          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar5 = Instruction::result_id(pIVar7);
      }
      else {
        this_01 = (LoopUnrollerUtilsImpl *)ppIVar14[uVar15];
        uVar5 = BasicBlock::id(*local_178);
        uVar5 = GetPhiDefID(this_01,(Instruction *)(ulong)uVar5,label);
      }
      local_1c4 = Instruction::result_id(pIVar7);
      pmVar8 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_1c4);
      *pmVar8 = uVar5;
      uVar11 = extraout_RDX_00;
    }
    condition_block = (this->state_).new_condition_block;
    if (condition_block != this->loop_condition_block_) {
      FoldConditionBlock(this,condition_block,(uint32_t)uVar11);
    }
    pLVar4 = local_1b8;
    uVar5 = BasicBlock::id(local_1b8->loop_header_);
    uVar6 = BasicBlock::id(pLVar4->loop_header_);
    induction_clone = (Instruction *)CONCAT44(induction_clone._4_4_,uVar6);
    pmVar8 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,(key_type *)&induction_clone);
    *pmVar8 = uVar5;
    p_Var13 = local_198;
    while (p_Var13 = p_Var13->_M_nxt, p_Var13 != (__node_base *)0x0) {
      RemapOperands(this,*(BasicBlock **)
                          &((_Prime_rehash_policy *)(p_Var13 + 2))->_M_max_load_factor);
    }
    ppIVar3 = (this->state_).new_phis_.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar14 = (this->state_).new_phis_.
                    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppIVar14 != ppIVar3;
        ppIVar14 = ppIVar14 + 1) {
      induction_clone = *ppIVar14;
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      push_back(local_170,&induction_clone);
    }
    (this->state_).previous_phi_ = (this->state_).new_phi;
    (this->state_).previous_latch_block_ = (this->state_).new_latch_block;
    (this->state_).previous_condition_block_ = (this->state_).new_condition_block;
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    _M_move_assign(local_188,__range2);
    local_1a0[2] = (Instruction *)0x0;
    local_1a0[3] = (Instruction *)0x0;
    *local_1a0 = (Instruction *)0x0;
    local_1a0[1] = (Instruction *)0x0;
    local_1a0[4] = (Instruction *)0x0;
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(local_190);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&this_00->_M_h);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(local_1b0);
    std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~_Vector_base(&inductions_1.
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 );
    lVar10 = local_180 + 1;
  } while( true );
}

Assistant:

void LoopUnrollerUtilsImpl::Unroll(Loop* loop, size_t factor) {
  // If we unroll a loop partially it will not be safe to unroll it further.
  // This is due to the current method of calculating the number of loop
  // iterations.
  MarkLoopControlAsDontUnroll(loop);

  std::vector<Instruction*> inductions;
  loop->GetInductionVariables(inductions);
  state_ = LoopUnrollState{loop_induction_variable_, loop->GetLatchBlock(),
                           loop_condition_block_, std::move(inductions)};
  for (size_t i = 0; i < factor - 1; ++i) {
    CopyBody(loop, true);
  }
}